

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.cpp
# Opt level: O1

void __thiscall
TasGrid::GridSequence::integrate(GridSequence *this,double *q,double *conformal_correction)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  pointer piVar5;
  size_t sVar6;
  long lVar7;
  pointer pdVar8;
  ulong uVar9;
  ulong uVar10;
  pointer piVar11;
  int j;
  double dVar12;
  vector<double,_std::allocator<double>_> w;
  allocator_type local_41;
  vector<double,_std::allocator<double>_> local_40;
  
  uVar1 = (this->super_BaseCanonicalGrid).points.cache_num_indexes;
  lVar7 = (long)(this->super_BaseCanonicalGrid).num_outputs;
  if (lVar7 != 0) {
    memset(q,0,lVar7 << 3);
  }
  if (conformal_correction == (double *)0x0) {
    cacheBasisIntegrals((vector<double,_std::allocator<double>_> *)&local_40,this);
    if (0 < (int)uVar1) {
      sVar4 = (this->super_BaseCanonicalGrid).points.num_dimensions;
      piVar5 = (this->super_BaseCanonicalGrid).points.indexes.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      sVar6 = (this->surpluses).stride;
      pdVar8 = (this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar2 = (this->super_BaseCanonicalGrid).num_dimensions;
      uVar3 = (this->super_BaseCanonicalGrid).num_outputs;
      uVar9 = 0;
      piVar11 = piVar5;
      do {
        dVar12 = local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[piVar5[sVar4 * uVar9]];
        if (1 < (int)uVar2) {
          uVar10 = 1;
          do {
            dVar12 = dVar12 * local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[piVar11[uVar10]];
            uVar10 = uVar10 + 1;
          } while (uVar2 != uVar10);
        }
        if (0 < (int)uVar3) {
          uVar10 = 0;
          do {
            q[uVar10] = pdVar8[uVar10] * dVar12 + q[uVar10];
            uVar10 = uVar10 + 1;
          } while (uVar3 != uVar10);
        }
        uVar9 = uVar9 + 1;
        piVar11 = piVar11 + sVar4;
        pdVar8 = pdVar8 + sVar6;
      } while (uVar9 != uVar1);
    }
  }
  else {
    ::std::vector<double,_std::allocator<double>_>::vector(&local_40,(long)(int)uVar1,&local_41);
    (*(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid[0xc])
              (this,local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
    if (0 < (int)uVar1) {
      sVar4 = (this->super_BaseCanonicalGrid).values.num_outputs;
      pdVar8 = (this->super_BaseCanonicalGrid).values.values.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      uVar2 = (this->super_BaseCanonicalGrid).num_outputs;
      uVar9 = 0;
      do {
        local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[uVar9] =
             conformal_correction[uVar9] *
             local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar9];
        if (0 < (int)uVar2) {
          uVar10 = 0;
          do {
            q[uVar10] = local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar9] * pdVar8[uVar10] + q[uVar10];
            uVar10 = uVar10 + 1;
          } while (uVar2 != uVar10);
        }
        uVar9 = uVar9 + 1;
        pdVar8 = pdVar8 + sVar4;
      } while (uVar9 != uVar1);
    }
  }
  if (local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GridSequence::integrate(double q[], double *conformal_correction) const{
    int num_points = points.getNumIndexes();
    std::fill(q, q + num_outputs, 0.0);

    // for sequence grids, quadrature weights are expensive,
    // if using simple integration use the basis integral + surpluses, which is fast
    // if using conformal map, then we have to compute the expensive weights
    if (conformal_correction == 0){
        std::vector<double> integ = cacheBasisIntegrals();
        for(int i=0; i<num_points; i++){
            const int* p = points.getIndex(i);
            double w = integ[p[0]];
            const double *s = surpluses.getStrip(i);
            for(int j=1; j<num_dimensions; j++){
                w *= integ[p[j]];
            }
            for(int k=0; k<num_outputs; k++){
                q[k] += w * s[k];
            }
        }
    }else{
        std::vector<double> w(num_points);
        getQuadratureWeights(w.data());
        for(int i=0; i<num_points; i++){
            w[i] *= conformal_correction[i];
            const double *vals = values.getValues(i);
            for(int k=0; k<num_outputs; k++){
                q[k] += w[i] * vals[k];
            }
        }
    }
}